

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * str_sanitize_filename(char *aName)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar2 = (byte *)aName;
  do {
    bVar1 = *pbVar2;
    uVar3 = (ulong)bVar1;
    if (uVar3 < 0x40) {
      if ((0xd400840400000000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0) {
          str_clean_whitespaces(aName);
          return aName;
        }
        goto LAB_0013e581;
      }
LAB_0013e574:
      *pbVar2 = 0x20;
    }
    else {
LAB_0013e581:
      if ((bVar1 == 0x7c) || (bVar1 == 0x5c)) goto LAB_0013e574;
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

char* str_sanitize_filename(char* aName)
{
	char *str = (char *)aName;
	while(*str)
	{
		// replace forbidden characters with a whispace
		if(*str == '/' || *str == '<' || *str == '>' || *str == ':' || *str == '"'
			|| *str == '/' || *str == '\\' || *str == '|' || *str == '?' || *str == '*')
 			*str = ' ';
		str++;
	}
	str_clean_whitespaces(aName);
	return aName;
}